

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O3

void __thiscall
Js::RecyclableObjectWalker::InsertItem
          (RecyclableObjectWalker *this,RecyclableObject *pOriginalObject,RecyclableObject *pObject,
          PropertyId propertyId,bool isReadOnly,bool isUnscoped,
          RecyclableMethodsGroupWalker **ppMethodsGroupWalker,bool shouldPinProperty)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Var itemObj;
  
  if (pOriginalObject == (RecyclableObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0xa84,"(pOriginalObject)","pOriginalObject");
    if (!bVar2) goto LAB_008b58e3;
    *puVar3 = 0;
  }
  if (pObject == (RecyclableObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0xa85,"(pObject)","pObject");
    if (!bVar2) goto LAB_008b58e3;
    *puVar3 = 0;
  }
  if (propertyId == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0xa86,"(propertyId)","propertyId");
    if (!bVar2) goto LAB_008b58e3;
    *puVar3 = 0;
  }
  if (ppMethodsGroupWalker == (RecyclableMethodsGroupWalker **)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0xa87,"(ppMethodsGroupWalker)","ppMethodsGroupWalker");
    if (!bVar2) {
LAB_008b58e3:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  if (propertyId == 0x1eb) {
    itemObj = GetObject(pObject,pObject,0x1eb,this->scriptContext);
    propertyId = 0x1eb;
  }
  else {
    itemObj = GetObject(pOriginalObject,pObject,propertyId,this->scriptContext);
  }
  InsertItem(this,propertyId,isReadOnly,isUnscoped,itemObj,ppMethodsGroupWalker,shouldPinProperty);
  return;
}

Assistant:

void RecyclableObjectWalker::InsertItem(
        Js::RecyclableObject *pOriginalObject,
        Js::RecyclableObject *pObject,
        PropertyId propertyId,
        bool isReadOnly,
        bool isUnscoped,
        Js::RecyclableMethodsGroupWalker **ppMethodsGroupWalker,
        bool shouldPinProperty /* = false*/)
    {
        Assert(pOriginalObject);
        Assert(pObject);
        Assert(propertyId);
        Assert(ppMethodsGroupWalker);

        if (propertyId != PropertyIds::__proto__)
        {
            InsertItem(propertyId, isReadOnly, isUnscoped, RecyclableObjectWalker::GetObject(pOriginalObject, pObject, propertyId, scriptContext), ppMethodsGroupWalker, shouldPinProperty);
        }
        else // Since __proto__ defined as a Getter we should always evaluate it against object itself instead of walking prototype chain
        {
            InsertItem(propertyId, isReadOnly, isUnscoped, RecyclableObjectWalker::GetObject(pObject, pObject, propertyId, scriptContext), ppMethodsGroupWalker, shouldPinProperty);
        }
    }